

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_sign
              (secp256k1_context *ctx,uchar *adaptor_sig65,uchar *adaptor_proof97,uchar *seckey32,
              secp256k1_pubkey *adaptor,uchar *msg32)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  secp256k1_ecmult_gen_context *ctx_00;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uchar nonce32 [32];
  uchar nonce32_1 [32];
  secp256k1_ge r;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_ge adaptor_ge;
  int overflow;
  secp256k1_gej r1j;
  secp256k1_ge p2;
  uchar buf32 [32];
  uchar key32 [32];
  uchar buf33 [33];
  secp256k1_scalar sp;
  secp256k1_gej rpj;
  secp256k1_gej rj;
  secp256k1_scalar msg;
  secp256k1_ge rp;
  secp256k1_ge r2;
  secp256k1_ge r1;
  secp256k1_ge *in_stack_fffffffffffff8e8;
  secp256k1_scalar local_6f8;
  secp256k1_scalar local_6d8;
  uchar local_6b8 [32];
  uchar local_698 [32];
  undefined1 local_678 [136];
  secp256k1_scalar local_5f0;
  secp256k1_scalar local_5d0;
  secp256k1_ge local_5b0;
  secp256k1_ge local_558;
  secp256k1_gej local_500;
  secp256k1_ge local_480;
  uchar local_428 [32];
  uchar local_408 [32];
  uchar local_3e8 [48];
  secp256k1_sha256 local_3b8;
  secp256k1_sha256 local_348;
  secp256k1_gej local_2e0;
  secp256k1_gej local_260;
  secp256k1_gej local_1e0;
  secp256k1_gej local_160;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_5();
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_4();
  }
  else if (adaptor_proof97 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_3();
  }
  else if (adaptor == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_2();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_1();
  }
  else {
    local_348.s[0] = 0x6a09e667;
    local_348.s[1] = 0xbb67ae85;
    local_348.s[2] = 0x3c6ef372;
    local_348.s[3] = 0xa54ff53a;
    local_348.s[4] = 0x510e527f;
    local_348.s[5] = 0x9b05688c;
    local_348.s[6] = 0x1f83d9ab;
    local_348.s[7] = 0x5be0cd19;
    local_348.bytes = 0;
    secp256k1_sha256_write(&local_348,msg32,0x20);
    iVar36 = secp256k1_pubkey_load(ctx,&local_5b0,adaptor);
    if (iVar36 == 0) {
      return 0;
    }
    secp256k1_dleq_serialize_point(local_3e8,&local_5b0);
    secp256k1_sha256_write(&local_348,local_3e8,0x21);
    secp256k1_sha256_finalize(&local_348,local_3e8);
    iVar36 = nonce_function_dleq(local_6b8,local_3e8,seckey32,(uchar *)"ECDSAAdaptorNon");
    if (iVar36 == 0) {
      return 0;
    }
    secp256k1_scalar_set_b32(&local_6f8,local_6b8,(int *)0x0);
    auVar55._0_4_ = -(uint)((int)local_6f8.d[2] == 0 && (int)local_6f8.d[0] == 0);
    auVar55._4_4_ = -(uint)(local_6f8.d[2]._4_4_ == 0 && local_6f8.d[0]._4_4_ == 0);
    auVar55._8_4_ = -(uint)((int)local_6f8.d[3] == 0 && (int)local_6f8.d[1] == 0);
    auVar55._12_4_ = -(uint)(local_6f8.d[3]._4_4_ == 0 && local_6f8.d[1]._4_4_ == 0);
    iVar36 = movmskps(extraout_EAX,auVar55);
    if (iVar36 == 0xf) {
      return 0;
    }
    ctx_00 = &ctx->ecmult_gen_ctx;
    secp256k1_ecmult_gen(ctx_00,&local_2e0,&local_6f8);
    secp256k1_ecmult_const(&local_260,&local_5b0,&local_6f8,0x100);
    secp256k1_ecmult_gen(ctx_00,(secp256k1_gej *)local_678,&local_6f8);
    secp256k1_ge_set_gej(&local_558,(secp256k1_gej *)local_678);
    secp256k1_ecmult_const(&local_160,&local_5b0,&local_6f8,0x100);
    secp256k1_ge_set_gej(&local_480,&local_160);
    local_3b8.s[0] = 0x6a09e667;
    local_3b8.s[1] = 0xbb67ae85;
    local_3b8.s[2] = 0x3c6ef372;
    local_3b8.s[3] = 0xa54ff53a;
    local_3b8.s[4] = 0x510e527f;
    local_3b8.s[5] = 0x9b05688c;
    local_3b8.s[6] = 0x1f83d9ab;
    local_3b8.s[7] = 0x5be0cd19;
    local_3b8.bytes = 0;
    secp256k1_dleq_serialize_point(local_678,&local_5b0);
    secp256k1_sha256_write(&local_3b8,local_678,0x21);
    secp256k1_dleq_serialize_point(local_678,&local_558);
    secp256k1_sha256_write(&local_3b8,local_678,0x21);
    secp256k1_dleq_serialize_point(local_678,&local_480);
    secp256k1_sha256_write(&local_3b8,local_678,0x21);
    secp256k1_sha256_finalize(&local_3b8,local_428);
    secp256k1_scalar_get_b32(local_408,&local_6f8);
    iVar36 = nonce_function_dleq(local_698,local_428,local_408,(uchar *)"ECDSAAdaptorSig");
    if (iVar36 == 0) {
      return 0;
    }
    secp256k1_scalar_set_b32(&local_6d8,local_698,(int *)0x0);
    auVar56._0_4_ = -(uint)((int)local_6d8.d[2] == 0 && (int)local_6d8.d[0] == 0);
    auVar56._4_4_ = -(uint)(local_6d8.d[2]._4_4_ == 0 && local_6d8.d[0]._4_4_ == 0);
    auVar56._8_4_ = -(uint)((int)local_6d8.d[3] == 0 && (int)local_6d8.d[1] == 0);
    auVar56._12_4_ = -(uint)(local_6d8.d[3]._4_4_ == 0 && local_6d8.d[1]._4_4_ == 0);
    iVar36 = movmskps(extraout_EAX_00,auVar56);
    if (iVar36 == 0xf) {
      return 0;
    }
    secp256k1_ecmult_gen(ctx_00,&local_500,&local_6d8);
    secp256k1_ge_set_gej(&local_88,&local_500);
    secp256k1_ecmult_const(&local_1e0,&local_5b0,&local_6d8,0x100);
    secp256k1_ge_set_gej(&local_e0,&local_1e0);
    secp256k1_dleq_challenge_hash
              (&local_5f0,(uchar *)&local_5b0,&local_88,&local_e0,&local_558,&local_480,
               in_stack_fffffffffffff8e8);
    uVar43 = CONCAT44(local_6f8.d[0]._4_4_,(int)local_6f8.d[0]);
    uVar44 = CONCAT44(local_6f8.d[1]._4_4_,(int)local_6f8.d[1]);
    uVar34 = CONCAT44(local_6f8.d[2]._4_4_,(int)local_6f8.d[2]);
    uVar35 = CONCAT44(local_6f8.d[3]._4_4_,(int)local_6f8.d[3]);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_5f0.d[0];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar43;
    uVar38 = SUB168(auVar1 * auVar17,8);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar38;
    local_678._0_8_ = SUB168(auVar1 * auVar17,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_5f0.d[0];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar44;
    auVar2 = auVar2 * auVar18;
    uVar45 = SUB168(auVar2 + auVar33,0);
    uVar48 = SUB168(auVar2 + auVar33,8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_5f0.d[1];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar43;
    uVar39 = SUB168(auVar3 * auVar19,8);
    uVar37 = SUB168(auVar3 * auVar19,0);
    local_678._8_8_ = uVar45 + uVar37;
    uVar37 = (ulong)CARRY8(uVar45,uVar37);
    uVar45 = uVar48 + uVar39;
    uVar49 = uVar45 + uVar37;
    uVar50 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar38,auVar2._0_8_)) +
             (ulong)(CARRY8(uVar48,uVar39) || CARRY8(uVar45,uVar37));
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_5f0.d[0];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar34;
    uVar40 = SUB168(auVar4 * auVar20,8);
    uVar37 = SUB168(auVar4 * auVar20,0);
    uVar38 = uVar49 + uVar37;
    uVar37 = (ulong)CARRY8(uVar49,uVar37);
    uVar39 = uVar50 + uVar40;
    uVar51 = uVar39 + uVar37;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_5f0.d[1];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar44;
    uVar41 = SUB168(auVar5 * auVar21,8);
    uVar45 = SUB168(auVar5 * auVar21,0);
    uVar49 = uVar38 + uVar45;
    uVar45 = (ulong)CARRY8(uVar38,uVar45);
    uVar48 = uVar51 + uVar41;
    uVar52 = uVar48 + uVar45;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_5f0.d[2];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar43;
    uVar42 = SUB168(auVar6 * auVar22,8);
    uVar38 = SUB168(auVar6 * auVar22,0);
    local_678._16_8_ = uVar49 + uVar38;
    uVar38 = (ulong)CARRY8(uVar49,uVar38);
    uVar49 = uVar52 + uVar42;
    uVar53 = uVar49 + uVar38;
    uVar52 = (ulong)(CARRY8(uVar50,uVar40) || CARRY8(uVar39,uVar37)) +
             (ulong)(CARRY8(uVar51,uVar41) || CARRY8(uVar48,uVar45)) +
             (ulong)(CARRY8(uVar52,uVar42) || CARRY8(uVar49,uVar38));
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_5f0.d[0];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar35;
    uVar41 = SUB168(auVar7 * auVar23,8);
    uVar37 = SUB168(auVar7 * auVar23,0);
    uVar38 = uVar53 + uVar37;
    uVar37 = (ulong)CARRY8(uVar53,uVar37);
    uVar48 = uVar52 + uVar41;
    uVar53 = uVar48 + uVar37;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_5f0.d[1];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar34;
    uVar42 = SUB168(auVar8 * auVar24,8);
    uVar45 = SUB168(auVar8 * auVar24,0);
    uVar39 = uVar38 + uVar45;
    uVar45 = (ulong)CARRY8(uVar38,uVar45);
    uVar49 = uVar53 + uVar42;
    uVar46 = uVar49 + uVar45;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_5f0.d[2];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar44;
    uVar50 = SUB168(auVar9 * auVar25,8);
    uVar38 = SUB168(auVar9 * auVar25,0);
    uVar54 = uVar39 + uVar38;
    uVar38 = (ulong)CARRY8(uVar39,uVar38);
    uVar40 = uVar46 + uVar50;
    uVar47 = uVar40 + uVar38;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_5f0.d[3];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar43;
    uVar51 = SUB168(auVar10 * auVar26,8);
    uVar39 = SUB168(auVar10 * auVar26,0);
    local_678._24_8_ = uVar54 + uVar39;
    uVar39 = (ulong)CARRY8(uVar54,uVar39);
    uVar43 = uVar47 + uVar51;
    uVar54 = uVar43 + uVar39;
    uVar41 = (ulong)(CARRY8(uVar52,uVar41) || CARRY8(uVar48,uVar37)) +
             (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar49,uVar45)) +
             (ulong)(CARRY8(uVar46,uVar50) || CARRY8(uVar40,uVar38)) +
             (ulong)(CARRY8(uVar47,uVar51) || CARRY8(uVar43,uVar39));
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_5f0.d[1];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar35;
    uVar40 = SUB168(auVar11 * auVar27,8);
    uVar37 = SUB168(auVar11 * auVar27,0);
    uVar38 = uVar54 + uVar37;
    uVar37 = (ulong)CARRY8(uVar54,uVar37);
    uVar39 = uVar41 + uVar40;
    uVar42 = uVar39 + uVar37;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_5f0.d[2];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar34;
    uVar43 = SUB168(auVar12 * auVar28,8);
    uVar45 = SUB168(auVar12 * auVar28,0);
    uVar49 = uVar38 + uVar45;
    uVar45 = (ulong)CARRY8(uVar38,uVar45);
    uVar48 = uVar42 + uVar43;
    uVar50 = uVar48 + uVar45;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_5f0.d[3];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar44;
    uVar44 = SUB168(auVar13 * auVar29,8);
    uVar38 = SUB168(auVar13 * auVar29,0);
    local_678._32_8_ = uVar49 + uVar38;
    uVar38 = (ulong)CARRY8(uVar49,uVar38);
    uVar49 = uVar50 + uVar44;
    uVar51 = uVar49 + uVar38;
    uVar40 = (ulong)(CARRY8(uVar41,uVar40) || CARRY8(uVar39,uVar37)) +
             (ulong)(CARRY8(uVar42,uVar43) || CARRY8(uVar48,uVar45)) +
             (ulong)(CARRY8(uVar50,uVar44) || CARRY8(uVar49,uVar38));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_5f0.d[2];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar35;
    uVar48 = SUB168(auVar14 * auVar30,8);
    uVar37 = SUB168(auVar14 * auVar30,0);
    uVar39 = uVar51 + uVar37;
    uVar37 = (ulong)CARRY8(uVar51,uVar37);
    uVar38 = uVar40 + uVar48;
    uVar43 = uVar38 + uVar37;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_5f0.d[3];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar34;
    uVar49 = SUB168(auVar15 * auVar31,8);
    uVar45 = SUB168(auVar15 * auVar31,0);
    local_678._40_8_ = uVar39 + uVar45;
    uVar45 = (ulong)CARRY8(uVar39,uVar45);
    uVar39 = uVar43 + uVar49;
    local_678._56_8_ =
         (ulong)(CARRY8(uVar40,uVar48) || CARRY8(uVar38,uVar37)) +
         (ulong)(CARRY8(uVar43,uVar49) || CARRY8(uVar39,uVar45));
    local_678._48_8_ = uVar39 + uVar45;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_5f0.d[3];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar35;
    local_678._48_16_ = auVar16 * auVar32 + local_678._48_16_;
    secp256k1_scalar_reduce_512(&local_5d0,(uint64_t *)local_678);
    secp256k1_scalar_add(&local_5d0,&local_5d0,&local_6d8);
    secp256k1_ge_set_gej((secp256k1_ge *)local_678,&local_260);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&local_500,seckey32,(int *)&local_558);
    if ((int)local_558.x.n[0] == 0) {
      if ((local_500.x.n[3] == 0 && local_500.x.n[1] == 0) &&
          (local_500.x.n[2] == 0 && local_500.x.n[0] == 0)) {
        return 0;
      }
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_1e0,msg32,(int *)0x0);
      iVar36 = secp256k1_ecdsa_adaptor_sign_helper
                         ((secp256k1_scalar *)&local_3b8,(secp256k1_scalar *)&local_1e0,&local_6f8,
                          (secp256k1_ge *)local_678,(secp256k1_scalar *)&local_500);
      if (iVar36 == 0) {
        return 0;
      }
      secp256k1_ge_set_gej((secp256k1_ge *)&local_160,&local_2e0);
      secp256k1_ecdsa_adaptor_proof_serialize
                (adaptor_proof97,(secp256k1_ge *)&local_160,&local_5d0,&local_5f0);
      secp256k1_dleq_serialize_point(adaptor_sig65,(secp256k1_ge *)local_678);
      secp256k1_scalar_get_b32(adaptor_sig65 + 0x21,(secp256k1_scalar *)&local_3b8);
      return 1;
    }
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_sign(const secp256k1_context* ctx, unsigned char *adaptor_sig65, unsigned char *adaptor_proof97, unsigned char *seckey32, const secp256k1_pubkey *adaptor, const unsigned char *msg32) {
    unsigned char nonce32[32];
    unsigned char buf33[33];
    secp256k1_sha256 sha;
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge adaptor_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(adaptor_proof97 != NULL);
    ARG_CHECK(adaptor != NULL);
    ARG_CHECK(msg32 != NULL);

    /* 1. Choose k randomly, R' = k*G */
    /* Include msg32 and adaptor in nonce derivation */
    secp256k1_sha256_initialize(&sha);
    secp256k1_sha256_write(&sha, msg32, 32);
    if (!secp256k1_pubkey_load(ctx, &adaptor_ge, adaptor)) {
        return 0;
    }
    secp256k1_dleq_serialize_point(buf33, &adaptor_ge);
    secp256k1_sha256_write(&sha, buf33, 33);
    secp256k1_sha256_finalize(&sha, buf33);
    if (!nonce_function_dleq(nonce32, buf33, seckey32, (unsigned char *)"ECDSAAdaptorNon")) {
        return 0;
    }
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    if (secp256k1_scalar_is_zero(&k)) {
        return 0;
    }
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);

    /* 2. R = k*Y; */
    secp256k1_ecmult_const(&rj, &adaptor_ge, &k, 256);

    /* 4. [sic] proof = DLEQ_prove((G,R'),(Y, R)) */
    if (!secp256k1_dleq_proof(&ctx->ecmult_gen_ctx, &dleq_proof_s, &dleq_proof_e, (unsigned char *)"ECDSAAdaptorSig", &k, &adaptor_ge)) {
        return 0;
    }

    /* 5. s' = k⁻¹(H(m) + x_coord(R)x) */
    secp256k1_ge_set_gej(&r, &rj);
    secp256k1_scalar_set_b32(&sk, seckey32, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&sk)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if(!secp256k1_ecdsa_adaptor_sign_helper(&sp, &msg, &k, &r, &sk)) {
        secp256k1_scalar_clear(&k);
        secp256k1_scalar_clear(&sk);
        return 0;
    }

    /* 6. return (R, R', s', proof) */
    secp256k1_ge_set_gej(&rp, &rpj);
    secp256k1_ecdsa_adaptor_proof_serialize(adaptor_proof97, &rp, &dleq_proof_s, &dleq_proof_e);
    secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig65, &r, &sp);

    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    return 1;
}